

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moneystr.cpp
# Opt level: O0

optional<long> ParseMoney(string *money_string)

{
  string_view str_00;
  __const_iterator __p;
  string_view str_01;
  string_view str_02;
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  size_type sVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  long in_FS_OFFSET;
  optional<long> oVar6;
  int64_t nWhole;
  int64_t nMult;
  char *p;
  int64_t nUnits;
  CAmount value;
  string strWhole;
  string str;
  undefined7 in_stack_fffffffffffffeb8;
  char in_stack_fffffffffffffebf;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  char in_stack_fffffffffffffed7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  size_t in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef5;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  string_view in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  long local_c0;
  _Storage<long,_true> local_58;
  undefined1 local_50;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffed8);
  str_00._M_str = in_stack_fffffffffffffee8;
  str_00._M_len = in_stack_fffffffffffffee0;
  bVar1 = util::ContainsNoNUL(str_00);
  if (bVar1) {
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffed8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffed8,
               (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    str_01._M_str = in_stack_ffffffffffffff38;
    str_01._M_len = (size_t)in_stack_ffffffffffffff30;
    util::TrimString_abi_cxx11_(str_01,in_stack_ffffffffffffff20);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    if (!bVar1) {
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
      local_c0 = 0;
      pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
LAB_00836758:
      if (*pcVar3 != '\0') {
        if (*pcVar3 != '.') {
          bVar1 = IsSpace(in_stack_fffffffffffffebf);
          if (bVar1) {
            std::optional<long>::optional((optional<long> *)&local_58);
          }
          else {
            uVar2 = IsDigit(in_stack_fffffffffffffebf);
            if ((bool)uVar2) goto LAB_008368d3;
            std::optional<long>::optional((optional<long> *)&local_58);
          }
          goto LAB_00836a86;
        }
        in_stack_ffffffffffffff30 = "rtialspends, grouping outputs by their addresses.";
        while( true ) {
          pcVar3 = pcVar3 + 1;
          bVar1 = IsDigit(in_stack_fffffffffffffebf);
          if (!bVar1 || (long)in_stack_ffffffffffffff30 < 1) break;
          local_c0 = (long)in_stack_ffffffffffffff30 * (long)(*pcVar3 + -0x30) + local_c0;
          in_stack_ffffffffffffff30 = (char *)((long)in_stack_ffffffffffffff30 / 10);
        }
      }
      if (*pcVar3 == '\0') {
        sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
        if (sVar4 < 0xb) {
          if ((local_c0 < 0) || (100000000 < local_c0)) {
            std::optional<long>::optional((optional<long> *)&local_58);
          }
          else {
            std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffed8);
            str_02._M_str = pcVar3;
            str_02._M_len = (size_t)in_stack_ffffffffffffff30;
            LocaleIndependentAtoi<long>(str_02);
            bVar1 = MoneyRange((CAmount *)
                               CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
            if (bVar1) {
              std::optional<long>::optional<long,_true>
                        ((optional<long> *)in_stack_fffffffffffffec8,
                         (long *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
            }
            else {
              std::optional<long>::optional((optional<long> *)&local_58);
            }
          }
        }
        else {
          std::optional<long>::optional((optional<long> *)&local_58);
        }
      }
      else {
        std::optional<long>::optional((optional<long> *)&local_58);
      }
LAB_00836a86:
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
      goto LAB_00836a93;
    }
    std::optional<long>::optional((optional<long> *)&local_58);
LAB_00836a93:
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    uVar5 = extraout_RDX_00;
  }
  else {
    std::optional<long>::optional((optional<long> *)&local_58);
    uVar5 = extraout_RDX;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    oVar6.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_7_
         = (undefined7)((ulong)uVar5 >> 8);
    oVar6.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_engaged = (bool)local_50;
    oVar6.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = local_58._M_value;
    return (optional<long>)
           oVar6.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
LAB_008368d3:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
            (in_stack_fffffffffffffec8);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffec8,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
  __p._M_current._4_1_ = uVar2;
  __p._M_current._0_4_ = in_stack_fffffffffffffef0;
  __p._M_current._5_1_ = in_stack_fffffffffffffef5;
  __p._M_current._6_1_ = in_stack_fffffffffffffef6;
  __p._M_current._7_1_ = in_stack_fffffffffffffef7;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
            (in_stack_fffffffffffffed8,__p,in_stack_fffffffffffffed7);
  pcVar3 = pcVar3 + 1;
  goto LAB_00836758;
}

Assistant:

std::optional<CAmount> ParseMoney(const std::string& money_string)
{
    if (!ContainsNoNUL(money_string)) {
        return std::nullopt;
    }
    const std::string str = TrimString(money_string);
    if (str.empty()) {
        return std::nullopt;
    }

    std::string strWhole;
    int64_t nUnits = 0;
    const char* p = str.c_str();
    for (; *p; p++)
    {
        if (*p == '.')
        {
            p++;
            int64_t nMult = COIN / 10;
            while (IsDigit(*p) && (nMult > 0))
            {
                nUnits += nMult * (*p++ - '0');
                nMult /= 10;
            }
            break;
        }
        if (IsSpace(*p))
            return std::nullopt;
        if (!IsDigit(*p))
            return std::nullopt;
        strWhole.insert(strWhole.end(), *p);
    }
    if (*p) {
        return std::nullopt;
    }
    if (strWhole.size() > 10) // guard against 63 bit overflow
        return std::nullopt;
    if (nUnits < 0 || nUnits > COIN)
        return std::nullopt;
    int64_t nWhole = LocaleIndependentAtoi<int64_t>(strWhole);
    CAmount value = nWhole * COIN + nUnits;

    if (!MoneyRange(value)) {
        return std::nullopt;
    }

    return value;
}